

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

Var Js::CharArray::EntrySubarray(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptContext *scriptContext;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                              ,0xd00,"(0)","not supported in char array");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar3 = 0;
  scriptContext = RecyclableObject::GetScriptContext(function);
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec25,(PCWSTR)0x0);
}

Assistant:

Var CharArray::EntrySubarray(RecyclableObject* function, CallInfo callInfo, ...)
    {
        AssertMsg(FALSE, "not supported in char array");
        JavascriptError::ThrowTypeError(function->GetScriptContext(), JSERR_This_NeedTypedArray);
    }